

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_apply_difficulty_factors.hpp
# Opt level: O0

void __thiscall
PatchApplyDifficultyFactors::alter_world(PatchApplyDifficultyFactors *this,World *world)

{
  EnemyType *this_00;
  bool bVar1;
  map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
  *this_01;
  double dVar2;
  EnemyType *enemy_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  type *local_48;
  type *entity_type;
  type *id;
  _Self local_30;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
  *__range1;
  World *world_local;
  PatchApplyDifficultyFactors *this_local;
  
  this_01 = World::entity_types(world);
  __end1 = std::
           map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
           ::begin(this_01);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_EntityType_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_EntityType_*>_>_>
       ::end(this_01);
  while (bVar1 = std::operator==(&__end1,&local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
    id = &std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_EntityType_*>_>::operator*
                    (&__end1)->first;
    entity_type = (type *)std::get<0ul,unsigned_char_const,EntityType*>
                                    ((pair<const_unsigned_char,_EntityType_*> *)id);
    local_48 = std::get<1ul,unsigned_char_const,EntityType*>
                         ((pair<const_unsigned_char,_EntityType_*> *)id);
    (**(*local_48)->_vptr_EntityType)();
    bVar1 = std::operator==(&local_68,"enemy");
    std::__cxx11::string::~string((string *)&local_68);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = (EnemyType *)*local_48;
      dVar2 = RandomizerOptions::enemies_damage_factor(this->_options);
      EnemyType::apply_damage_factor(this_00,dVar2);
      dVar2 = RandomizerOptions::enemies_health_factor(this->_options);
      EnemyType::apply_health_factor(this_00,dVar2);
      dVar2 = RandomizerOptions::enemies_armor_factor(this->_options);
      EnemyType::apply_armor_factor(this_00,dVar2);
      dVar2 = RandomizerOptions::enemies_golds_factor(this->_options);
      EnemyType::apply_golds_factor(this_00,dVar2);
      dVar2 = RandomizerOptions::enemies_drop_chance_factor(this->_options);
      EnemyType::apply_drop_chance_factor(this_00,dVar2);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_EntityType_*>_>::operator++(&__end1)
    ;
  }
  return;
}

Assistant:

void alter_world(World& world) override
    {
        // Apply multiplicators from randomizer settings
        for (auto& [id, entity_type] : world.entity_types())
        {
            if(entity_type->type_name() != "enemy")
                continue;
            EnemyType* enemy_type = reinterpret_cast<EnemyType*>(entity_type);

            enemy_type->apply_damage_factor(_options.enemies_damage_factor());
            enemy_type->apply_health_factor(_options.enemies_health_factor());
            enemy_type->apply_armor_factor(_options.enemies_armor_factor());
            enemy_type->apply_golds_factor(_options.enemies_golds_factor());
            enemy_type->apply_drop_chance_factor(_options.enemies_drop_chance_factor());
        }
    }